

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O2

void __thiscall PrintC::emitPrototypeInputs(PrintC *this,FuncProto *proto)

{
  EmitXml *pEVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar5;
  undefined8 uVar6;
  int iVar7;
  ulong uVar8;
  allocator local_79;
  Atom local_78;
  string local_50;
  long *plVar4;
  
  iVar2 = (*proto->store->_vptr_ProtoStore[5])();
  if (iVar2 == 0) {
    pEVar1 = (this->super_PrintLanguage).emit;
    (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"void",0);
    if ((proto->flags & 1) == 0) {
      return;
    }
  }
  else {
    uVar8 = 0;
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    while (iVar7 = (int)uVar8, iVar2 != iVar7) {
      if (iVar7 != 0) {
        pEVar1 = (this->super_PrintLanguage).emit;
        (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,",",8);
      }
      iVar3 = (*proto->store->_vptr_ProtoStore[6])(proto->store,uVar8);
      plVar4 = (long *)CONCAT44(extraout_var,iVar3);
      lVar5 = (**(code **)(*plVar4 + 0x88))(plVar4);
      if (lVar5 == 0) {
        uVar6 = (**(code **)(*plVar4 + 0x18))(plVar4);
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x6e])(this,uVar6,1);
        std::__cxx11::string::string((string *)&local_50,"",&local_79);
        local_78.type = blanktoken;
        local_78.highlight = no_color;
        local_78.name = &local_50;
        PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_78);
        std::__cxx11::string::~string((string *)&local_50);
        uVar6 = (**(code **)(*plVar4 + 0x18))(plVar4);
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x6f])(this,uVar6);
        PrintLanguage::recurse(&this->super_PrintLanguage);
      }
      else {
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[10])(this,lVar5);
      }
      uVar8 = (ulong)(iVar7 + 1);
    }
    if ((proto->flags & 1) == 0) {
      return;
    }
    pEVar1 = (this->super_PrintLanguage).emit;
    (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,",",8);
  }
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"...",8);
  return;
}

Assistant:

void PrintC::emitPrototypeInputs(const FuncProto *proto)

{
  int4 sz = proto->numParams();
  
  if (sz == 0)
    emit->print("void",EmitXml::keyword_color);
  else {
    for(int4 i=0;i<sz;++i) {
      if (i!=0)
	emit->print(",");
      ProtoParameter *param = proto->getParam(i);
      Symbol *sym = param->getSymbol();
      if (sym != (Symbol *)0)
	emitVarDecl(sym);
      else {
	// Emit type without name, if there is no backing symbol
	pushTypeStart(param->getType(),true);
	pushAtom(Atom("",blanktoken,EmitXml::no_color));
	pushTypeEnd(param->getType());
	recurse();
      }
    }
  }
  if (proto->isDotdotdot()) {
    if (sz != 0)
      emit->print(",");
    emit->print("...");
  }
}